

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O1

void __thiscall
solitaire::piles::FoundationPileWithAceTest::FoundationPileWithAceTest
          (FoundationPileWithAceTest *this)

{
  shared_ptr<solitaire::piles::FoundationPile> *this_00;
  initializer_list<solitaire::cards::Card> __l;
  optional<solitaire::cards::Card> cardToAdd;
  allocator_type local_29;
  Card local_28;
  undefined1 local_20;
  
  testing::Test::Test((Test *)this);
  (this->super_EmptyFoundationPileTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EmptyFoundationPileTest_00330fe0;
  this_00 = &(this->super_EmptyFoundationPileTest).pile;
  std::__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<solitaire::piles::FoundationPile>>
            ((__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (allocator<solitaire::piles::FoundationPile> *)&local_28);
  (this->super_EmptyFoundationPileTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileWithAceTest_00331160;
  solitaire::cards::Card::Card(&local_28,Ace,Heart);
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->pileCards,__l,&local_29);
  local_28 = *(this->pileCards).
              super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_20 = 1;
  (*(((this_00->super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>).
     _M_ptr)->super_FoundationPile).super_Archiver._vptr_Archiver[4])();
  return;
}

Assistant:

FoundationPileWithAceTest() {
        std::optional<Card> cardToAdd = pileCards.front();
        pile->tryAddCard(cardToAdd);
    }